

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# line_info.cc
# Opt level: O2

void __thiscall
bloaty::dwarf::LineInfoReader::SeekToOffset
          (LineInfoReader *this,uint64_t offset,uint8_t address_size)

{
  CompilationUnitSizes *this_00;
  uint8_t uVar1;
  pointer pbVar2;
  pointer pFVar3;
  int line;
  uchar uVar4;
  char cVar5;
  byte bVar6;
  unsigned_short uVar7;
  uint uVar8;
  uint64_t bytes;
  char *str;
  size_t i;
  ulong uVar9;
  string_view local_78;
  string_view dir;
  string_view program;
  
  local_78 = this->file_->debug_line;
  ReadBytes(offset,&local_78);
  this_00 = &this->sizes_;
  CompilationUnitSizes::SetAddressSize(this_00,address_size);
  local_78 = CompilationUnitSizes::ReadInitialLength(this_00,&local_78);
  uVar7 = ReadFixed<unsigned_short,2ul>(&local_78);
  (this->sizes_).dwarf_version_ = uVar7;
  bytes = CompilationUnitSizes::ReadDWARFOffset(this_00,&local_78);
  program._M_len = local_78._M_len;
  program._M_str = local_78._M_str;
  ReadBytes(bytes,&program);
  uVar4 = ReadFixed<unsigned_char,1ul>(&local_78);
  (this->params_).minimum_instruction_length = uVar4;
  if ((char)(this->sizes_).dwarf_version_ == '\x04') {
    uVar4 = ReadFixed<unsigned_char,1ul>(&local_78);
    (this->params_).maximum_operations_per_instruction = uVar4;
    if (uVar4 == '\0') {
      str = "DWARF line info had maximum_operations_per_instruction=0";
      line = 0x5c;
      goto LAB_00197283;
    }
  }
  else {
    (this->params_).maximum_operations_per_instruction = '\x01';
  }
  uVar4 = ReadFixed<unsigned_char,1ul>(&local_78);
  (this->params_).default_is_stmt = uVar4;
  cVar5 = ReadFixed<signed_char,1ul>(&local_78);
  (this->params_).line_base = cVar5;
  uVar4 = ReadFixed<unsigned_char,1ul>(&local_78);
  (this->params_).line_range = uVar4;
  bVar6 = ReadFixed<unsigned_char,1ul>(&local_78);
  (this->params_).opcode_base = bVar6;
  if ((this->params_).line_range != '\0') {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (&this->standard_opcode_lengths_,(ulong)bVar6);
    for (uVar9 = 1; uVar9 < (this->params_).opcode_base; uVar9 = uVar9 + 1) {
      uVar4 = ReadFixed<unsigned_char,1ul>(&local_78);
      (this->standard_opcode_lengths_).
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start[uVar9] = uVar4;
    }
    pbVar2 = (this->include_directories_).
             super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((this->include_directories_).
        super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish != pbVar2) {
      (this->include_directories_).
      super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = pbVar2;
    }
    dir = (string_view)ZEXT816(0);
    std::
    vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
    ::emplace_back<std::basic_string_view<char,std::char_traits<char>>>
              ((vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                *)&this->include_directories_,&dir);
    while( true ) {
      dir = ReadNullTerminated(&local_78);
      if (dir._M_len == 0) break;
      std::
      vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ::push_back(&this->include_directories_,&dir);
    }
    pFVar3 = (this->filenames_).
             super__Vector_base<bloaty::dwarf::LineInfoReader::FileName,_std::allocator<bloaty::dwarf::LineInfoReader::FileName>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((this->filenames_).
        super__Vector_base<bloaty::dwarf::LineInfoReader::FileName,_std::allocator<bloaty::dwarf::LineInfoReader::FileName>_>
        ._M_impl.super__Vector_impl_data._M_finish != pFVar3) {
      (this->filenames_).
      super__Vector_base<bloaty::dwarf::LineInfoReader::FileName,_std::allocator<bloaty::dwarf::LineInfoReader::FileName>_>
      ._M_impl.super__Vector_impl_data._M_finish = pFVar3;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(&this->expanded_filenames_);
    dir = (string_view)ZEXT816(0);
    std::
    vector<bloaty::dwarf::LineInfoReader::FileName,_std::allocator<bloaty::dwarf::LineInfoReader::FileName>_>
    ::emplace_back<bloaty::dwarf::LineInfoReader::FileName>(&this->filenames_,(FileName *)&dir);
    while( true ) {
      dir = (string_view)ZEXT816(0);
      dir = ReadNullTerminated(&local_78);
      if (dir._M_len == 0) {
        (this->info_).address = 0;
        (this->info_).end_sequence = false;
        (this->info_).basic_block = false;
        (this->info_).prologue_end = false;
        (this->info_).epilogue_begin = false;
        (this->info_).column = 0;
        (this->info_).discriminator = 0;
        uVar1 = (this->params_).default_is_stmt;
        (this->info_).file = 1;
        (this->info_).line = 1;
        (this->info_).is_stmt = uVar1 != '\0';
        (this->info_).op_index = '\0';
        (this->info_).isa = '\0';
        (this->remaining_)._M_len = program._M_len;
        (this->remaining_)._M_str = program._M_str;
        this->shadow_ = false;
        return;
      }
      uVar8 = ReadLEB128<unsigned_int>(&local_78);
      ReadLEB128<unsigned_long>(&local_78);
      ReadLEB128<unsigned_long>(&local_78);
      if ((ulong)((long)(this->include_directories_).
                        super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->include_directories_).
                        super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 4) <= (ulong)uVar8) break;
      std::
      vector<bloaty::dwarf::LineInfoReader::FileName,_std::allocator<bloaty::dwarf::LineInfoReader::FileName>_>
      ::push_back(&this->filenames_,(FileName *)&dir);
    }
    Throw("directory index out of range",0x8c);
  }
  str = "line_range of zero will cause divide by zero";
  line = 0x66;
LAB_00197283:
  Throw(str,line);
}

Assistant:

void LineInfoReader::SeekToOffset(uint64_t offset, uint8_t address_size) {
  string_view data = file_.debug_line;
  SkipBytes(offset, &data);

  sizes_.SetAddressSize(address_size);
  data = sizes_.ReadInitialLength(&data);
  sizes_.ReadDWARFVersion(&data);
  uint64_t header_length = sizes_.ReadDWARFOffset(&data);
  string_view program = data;
  SkipBytes(header_length, &program);

  params_.minimum_instruction_length = ReadFixed<uint8_t>(&data);
  if (sizes_.dwarf_version() == 4) {
    params_.maximum_operations_per_instruction = ReadFixed<uint8_t>(&data);

    if (params_.maximum_operations_per_instruction == 0) {
      THROW("DWARF line info had maximum_operations_per_instruction=0");
    }
  } else {
    params_.maximum_operations_per_instruction = 1;
  }
  params_.default_is_stmt = ReadFixed<uint8_t>(&data);
  params_.line_base = ReadFixed<int8_t>(&data);
  params_.line_range = ReadFixed<uint8_t>(&data);
  params_.opcode_base = ReadFixed<uint8_t>(&data);
  if (params_.line_range == 0) {
    THROW("line_range of zero will cause divide by zero");
  }

  standard_opcode_lengths_.resize(params_.opcode_base);
  for (size_t i = 1; i < params_.opcode_base; i++) {
    standard_opcode_lengths_[i] = ReadFixed<uint8_t>(&data);
  }

  // Read include_directories.
  include_directories_.clear();

  // Implicit current directory entry.
  include_directories_.push_back(string_view());

  while (true) {
    string_view dir = ReadNullTerminated(&data);
    if (dir.empty()) {
      break;
    }
    include_directories_.push_back(dir);
  }

  // Read file_names.
  filenames_.clear();
  expanded_filenames_.clear();

  // Filename 0 is unused.
  filenames_.push_back(FileName());
  while (true) {
    FileName file_name;
    file_name.name = ReadNullTerminated(&data);
    if (file_name.name.empty()) {
      break;
    }
    file_name.directory_index = ReadLEB128<uint32_t>(&data);
    file_name.modified_time = ReadLEB128<uint64_t>(&data);
    file_name.file_size = ReadLEB128<uint64_t>(&data);
    if (file_name.directory_index >= include_directories_.size()) {
      THROW("directory index out of range");
    }
    filenames_.push_back(file_name);
  }

  info_ = LineInfo(params_.default_is_stmt);
  remaining_ = program;
  shadow_ = false;
}